

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O2

bool wallet::AddWalletSetting(Chain *chain,string *wallet_name)

{
  undefined1 uVar1;
  long in_FS_OFFSET;
  _Any_data local_68;
  code *local_58;
  code *local_50;
  allocator<char> local_41;
  string local_40 [32];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>(local_40,"wallet",&local_41);
  local_68._8_8_ = 0;
  local_50 = std::
             _Function_handler<std::optional<interfaces::SettingsAction>_(UniValue_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp:96:34)>
             ::_M_invoke;
  local_58 = std::
             _Function_handler<std::optional<interfaces::SettingsAction>_(UniValue_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp:96:34)>
             ::_M_manager;
  local_68._M_unused._M_object = wallet_name;
  uVar1 = (**(code **)(*(long *)chain + 0x188))(chain,local_40);
  std::_Function_base::~_Function_base((_Function_base *)&local_68);
  std::__cxx11::string::~string(local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (bool)uVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool AddWalletSetting(interfaces::Chain& chain, const std::string& wallet_name)
{
    const auto update_function = [&wallet_name](common::SettingsValue& setting_value) {
        if (!setting_value.isArray()) setting_value.setArray();
        for (const auto& value : setting_value.getValues()) {
            if (value.isStr() && value.get_str() == wallet_name) return interfaces::SettingsAction::SKIP_WRITE;
        }
        setting_value.push_back(wallet_name);
        return interfaces::SettingsAction::WRITE;
    };
    return chain.updateRwSetting("wallet", update_function);
}